

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

void __thiscall ODDLParser::Reference::Reference(Reference *this,Reference *ref)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Name **ppNVar3;
  Name *this_00;
  ulong local_20;
  size_t i;
  Reference *ref_local;
  Reference *this_local;
  
  this->m_numRefs = ref->m_numRefs;
  if (this->m_numRefs != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_numRefs;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppNVar3 = (Name **)operator_new__(uVar2);
    this->m_referencedName = ppNVar3;
    for (local_20 = 0; local_20 < this->m_numRefs; local_20 = local_20 + 1) {
      this_00 = (Name *)operator_new(0x10);
      Name::Name(this_00,ref->m_referencedName[local_20]);
      this->m_referencedName[local_20] = this_00;
    }
  }
  return;
}

Assistant:

Reference::Reference(const Reference &ref) {
    m_numRefs=ref.m_numRefs;
    if(m_numRefs!=0){
        m_referencedName = new Name*[m_numRefs];
        for ( size_t i = 0; i < m_numRefs; i++ ) {
            m_referencedName[i] = new Name(*ref.m_referencedName[i]);
        }
    }
}